

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpk.c
# Opt level: O0

void XPK_Free(XPK *xpk)

{
  int local_14;
  int i;
  XPK *xpk_local;
  
  if (xpk->file != (FILE *)0x0) {
    fclose((FILE *)xpk->file);
  }
  for (local_14 = 0; local_14 < (int)(uint)xpk->n_entries; local_14 = local_14 + 1) {
    XPKEntry_Free(xpk->entries[local_14]);
  }
  CLU_Free(xpk->clu);
  free(xpk);
  return;
}

Assistant:

void
XPK_Free(XPK *xpk)
{
	if (xpk->file) fclose(xpk->file);
	for (int i = 0; i < xpk->n_entries; i++) {
		XPKEntry_Free(xpk->entries[i]);
	}
	CLU_Free(xpk->clu);
	free(xpk);
}